

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

DataTypeExpression * __thiscall
slang::BumpAllocator::
emplace<slang::ast::DataTypeExpression,slang::ast::Type_const&,slang::SourceRange>
          (BumpAllocator *this,Type *args,SourceRange *args_1)

{
  SourceRange sourceRange;
  DataTypeExpression *pDVar1;
  SourceLocation in_RDX;
  SourceLocation in_RSI;
  size_t in_stack_ffffffffffffffd8;
  size_t in_stack_ffffffffffffffe0;
  
  pDVar1 = (DataTypeExpression *)
           allocate((BumpAllocator *)in_RDX,in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  sourceRange.endLoc = in_RSI;
  sourceRange.startLoc = in_RDX;
  ast::DataTypeExpression::DataTypeExpression
            (*(DataTypeExpression **)((long)in_RDX + 8),*(Type **)in_RDX,sourceRange);
  return pDVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }